

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

qreal __thiscall
QScrollerPrivate::scrollingSegmentsEndPos(QScrollerPrivate *this,Orientation orientation)

{
  bool bVar1;
  ScrollSegment *pSVar2;
  int in_ESI;
  long in_RDI;
  qreal qVar3;
  QList<QScrollerPrivate::ScrollSegment> *in_stack_ffffffffffffffc8;
  qreal local_8;
  
  if (in_ESI == 1) {
    bVar1 = QList<QScrollerPrivate::ScrollSegment>::isEmpty
                      ((QList<QScrollerPrivate::ScrollSegment> *)0xa824e3);
    if (bVar1) {
      local_8 = QPointF::x((QPointF *)(in_RDI + 0x68));
      qVar3 = QPointF::x((QPointF *)(in_RDI + 0x78));
      local_8 = local_8 + qVar3;
    }
    else {
      pSVar2 = QList<QScrollerPrivate::ScrollSegment>::last(in_stack_ffffffffffffffc8);
      local_8 = pSVar2->stopPos;
    }
  }
  else {
    bVar1 = QList<QScrollerPrivate::ScrollSegment>::isEmpty
                      ((QList<QScrollerPrivate::ScrollSegment> *)0xa82552);
    if (bVar1) {
      local_8 = QPointF::y((QPointF *)(in_RDI + 0x68));
      qVar3 = QPointF::y((QPointF *)(in_RDI + 0x78));
      local_8 = local_8 + qVar3;
    }
    else {
      pSVar2 = QList<QScrollerPrivate::ScrollSegment>::last(in_stack_ffffffffffffffc8);
      local_8 = pSVar2->stopPos;
    }
  }
  return local_8;
}

Assistant:

qreal QScrollerPrivate::scrollingSegmentsEndPos(Qt::Orientation orientation) const
{
    if (orientation == Qt::Horizontal) {
        if (xSegments.isEmpty())
            return contentPosition.x() + overshootPosition.x();
        else
            return xSegments.last().stopPos;
    } else {
        if (ySegments.isEmpty())
            return contentPosition.y() + overshootPosition.y();
        else
            return ySegments.last().stopPos;
    }
}